

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O3

QByteArray * getEtcFileContent(QByteArray *__return_storage_ptr__,char *filename)

{
  QByteArray *pQVar1;
  Data *pDVar2;
  char *__buf;
  int __fd;
  int iVar3;
  int *piVar4;
  ssize_t size;
  long in_FS_OFFSET;
  stat64 sbuf;
  stat64 local_c0;
  QByteArray *local_30;
  
  local_30 = *(QByteArray **)(in_FS_OFFSET + 0x28);
  do {
    __fd = open64(filename,0x80000,0x1ff);
    if (__fd != -1) {
      memset(&local_c0,0xaa,0x90);
      iVar3 = fstat64(__fd,&local_c0);
      if (iVar3 == -1) goto LAB_00218fd2;
      (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
      QByteArray::QByteArray(__return_storage_ptr__,local_c0.st_size,Uninitialized);
      pDVar2 = (__return_storage_ptr__->d).d;
      if ((pDVar2 == (Data *)0x0) ||
         (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QByteArray::reallocData(__return_storage_ptr__,(__return_storage_ptr__->d).size,KeepSize);
      }
      __buf = (__return_storage_ptr__->d).ptr;
      goto LAB_00218f60;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  goto LAB_00218ebc;
  while (piVar4 = __errno_location(), *piVar4 == 4) {
LAB_00218f60:
    size = read(__fd,__buf,local_c0.st_size);
    if (size != -1) break;
  }
  QByteArray::resize(__return_storage_ptr__,size);
  do {
    iVar3 = close(__fd);
    if (iVar3 != -1) break;
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  if (*(QByteArray **)(in_FS_OFFSET + 0x28) == local_30) {
    return *(QByteArray **)(in_FS_OFFSET + 0x28);
  }
  goto LAB_00219019;
  while (piVar4 = __errno_location(), *piVar4 == 4) {
LAB_00218fd2:
    iVar3 = close(__fd);
    if (iVar3 != -1) break;
  }
LAB_00218ebc:
  pQVar1 = *(QByteArray **)(in_FS_OFFSET + 0x28);
  if (pQVar1 == local_30) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return pQVar1;
  }
LAB_00219019:
  __stack_chk_fail();
}

Assistant:

static QByteArray getEtcFileContent(const char *filename)
{
    // we're avoiding QFile here
    int fd = qt_safe_open(filename, O_RDONLY);
    if (fd == -1)
        return QByteArray();

    QT_STATBUF sbuf;
    if (QT_FSTAT(fd, &sbuf) == -1) {
        qt_safe_close(fd);
        return QByteArray();
    }

    QByteArray buffer(sbuf.st_size, Qt::Uninitialized);
    buffer.resize(qt_safe_read(fd, buffer.data(), sbuf.st_size));
    qt_safe_close(fd);
    return buffer;
}